

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall MemoryAccountant::clear(MemoryAccountant *this)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *to_be_deleted;
  MemoryAccountantAllocationNode *node;
  MemoryAccountant *this_local;
  
  to_be_deleted = this->head_;
  while (to_be_deleted != (MemoryAccountantAllocationNode *)0x0) {
    pMVar1 = to_be_deleted->next_;
    destroyAccountantAllocationNode(this,to_be_deleted);
    to_be_deleted = pMVar1;
  }
  this->head_ = (MemoryAccountantAllocationNode *)0x0;
  return;
}

Assistant:

void MemoryAccountant::clear()
{
    MemoryAccountantAllocationNode* node = head_;
    MemoryAccountantAllocationNode* to_be_deleted = NULLPTR;
    while (node) {
        to_be_deleted = node;
        node = node->next_;
        destroyAccountantAllocationNode(to_be_deleted);
    }
    head_ = NULLPTR;
}